

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

int __thiscall ncnn::Padding::forward(Padding *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint _c;
  float fVar5;
  int *piVar6;
  size_t _elemsize;
  void *pvVar7;
  size_t sVar8;
  unsigned_short uVar9;
  int iVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  int local_138;
  Mat m_1;
  Mat m;
  ulong uVar17;
  
  uVar1 = this->left;
  uVar3 = this->right;
  uVar2 = this->front;
  uVar4 = this->behind;
  auVar27._0_4_ = -(uint)(uVar1 == 0);
  auVar27._4_4_ = -(uint)(uVar3 == 0);
  auVar27._8_4_ = -(uint)(uVar2 == 0);
  auVar27._12_4_ = -(uint)(uVar4 == 0);
  iVar24 = movmskps((int)this,auVar27);
  if ((this->bottom == 0 && this->top == 0) && iVar24 == 0xf) {
    local_138 = 0;
    if (top_blob != bottom_blob) {
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = top_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar6 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar6;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar24 = bottom_blob->w;
      iVar22 = bottom_blob->h;
      iVar19 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar24;
      top_blob->h = iVar22;
      top_blob->d = iVar19;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar24 = bottom_blob->dims;
    _elemsize = bottom_blob->elemsize;
    iVar22 = uVar3 + uVar1 + bottom_blob->w;
    local_138 = -100;
    if (iVar24 == 1) {
      Mat::create(top_blob,iVar22,_elemsize,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (_elemsize == 4) {
          local_138 = 0;
          copy_make_border_image<float>(bottom_blob,top_blob,0,this->left,this->type,this->value);
        }
        else if (_elemsize == 2) {
          iVar24 = this->left;
          iVar22 = this->type;
          if (((this->super_Layer).support_fp16_storage == true) && (opt->use_fp16_storage == true))
          {
            uVar9 = float32_to_float16(this->value);
          }
          else {
            uVar9 = *(unsigned_short *)((long)&this->value + 2);
          }
          local_138 = 0;
          copy_make_border_image<unsigned_short>(bottom_blob,top_blob,0,iVar24,iVar22,uVar9);
        }
        else {
          local_138 = 0;
          if (_elemsize == 1) {
            local_138 = 0;
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,0,this->left,this->type,(char)(int)this->value);
          }
        }
      }
    }
    else {
      _c = bottom_blob->c;
      uVar17 = (ulong)_c;
      iVar19 = this->bottom + this->top + bottom_blob->h;
      if (iVar24 == 4) {
        iVar24 = bottom_blob->d;
        uVar15 = uVar4 + uVar2 + iVar24;
        uVar23 = (ulong)uVar15;
        Mat::create(top_blob,iVar22,iVar19,uVar15,_c,_elemsize,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)uVar15 < 1) {
            uVar23 = 0;
          }
          iVar22 = iVar24 + -1;
          local_138 = 0;
          if ((int)_c < 1) {
            uVar17 = 0;
          }
          for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
            pfVar11 = (float *)(uVar20 * 4 + (long)(this->per_channel_pad_data).data);
            if (this->per_channel_pad_data_size == 0) {
              pfVar11 = &this->value;
            }
            fVar5 = *pfVar11;
            for (uVar18 = 0; uVar18 != uVar23; uVar18 = uVar18 + 1) {
              m.w = top_blob->w;
              lVar26 = (long)m.w;
              m.h = top_blob->h;
              lVar25 = (long)m.h;
              pvVar7 = top_blob->data;
              sVar8 = top_blob->elemsize;
              lVar12 = top_blob->cstep * uVar20;
              m.elempack = top_blob->elempack;
              uVar21 = lVar25 * lVar26;
              m.data = (void *)((long)pvVar7 + uVar18 * sVar8 * uVar21 + lVar12 * sVar8);
              m.allocator = top_blob->allocator;
              m.refcount = (int *)0x0;
              m.dims = 2;
              m.d = 1;
              m.c = 1;
              iVar19 = this->front;
              iVar10 = this->type;
              uVar9 = (unsigned_short)((uint)fVar5 >> 0x10);
              m.cstep = uVar21;
              m.elemsize = sVar8;
              if (iVar10 == 0 &&
                  ((long)(iVar19 + iVar24) <= (long)uVar18 || (long)uVar18 < (long)iVar19)) {
                iVar19 = (int)uVar21;
                if (_elemsize == 4) {
                  if (iVar19 < 1) {
                    iVar19 = 0;
                  }
                  for (lVar14 = 0; iVar19 != (int)lVar14; lVar14 = lVar14 + 1) {
                    *(float *)((long)pvVar7 +
                              lVar14 * 4 + sVar8 * (lVar25 * uVar18 * lVar26 + lVar12)) = fVar5;
                  }
                }
                else if (_elemsize == 2) {
                  if (((this->super_Layer).support_fp16_storage == true) &&
                     (opt->use_fp16_storage == true)) {
                    uVar9 = float32_to_float16(fVar5);
                  }
                  uVar21 = uVar21 & 0xffffffff;
                  if (iVar19 < 1) {
                    uVar21 = 0;
                  }
                  for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
                    *(unsigned_short *)
                     ((long)pvVar7 + uVar13 * 2 + sVar8 * (lVar25 * uVar18 * lVar26 + lVar12)) =
                         uVar9;
                  }
                }
                else if (_elemsize == 1) {
                  uVar21 = uVar21 & 0xffffffff;
                  if (iVar19 < 1) {
                    uVar21 = 0;
                  }
                  for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
                    *(char *)((long)pvVar7 + uVar13 + sVar8 * (lVar25 * uVar18 * lVar26 + lVar12)) =
                         (char)(int)fVar5;
                  }
                }
              }
              else {
                iVar19 = (int)uVar18 - iVar19;
                if (iVar10 == 2) {
                  iVar16 = -iVar19;
                  if (0 < iVar19) {
                    iVar16 = iVar19;
                  }
                  iVar16 = iVar16 - iVar22;
                  iVar19 = -iVar16;
                  if (iVar16 < 1) {
                    iVar19 = iVar16;
                  }
                  iVar19 = iVar19 + iVar22;
                }
                else if (iVar10 == 1) {
                  if (iVar19 < 1) {
                    iVar19 = 0;
                  }
                  if (iVar22 <= iVar19) {
                    iVar19 = iVar22;
                  }
                }
                m_1.w = bottom_blob->w;
                m_1.h = bottom_blob->h;
                m_1.elemsize = bottom_blob->elemsize;
                m_1.elempack = bottom_blob->elempack;
                m_1.allocator = bottom_blob->allocator;
                m_1.cstep = (long)m_1.h * (long)m_1.w;
                m_1.data = (void *)((long)bottom_blob->data +
                                   (long)iVar19 * m_1.elemsize * m_1.cstep +
                                   bottom_blob->cstep * uVar20 * m_1.elemsize);
                m_1.refcount = (int *)0x0;
                m_1.dims = 2;
                m_1.d = 1;
                m_1.c = 1;
                if (_elemsize == 4) {
                  copy_make_border_image<float>(&m_1,&m,this->top,this->left,iVar10,fVar5);
                }
                else if (_elemsize == 2) {
                  iVar19 = this->top;
                  iVar16 = this->left;
                  if (((this->super_Layer).support_fp16_storage == true) &&
                     (opt->use_fp16_storage == true)) {
                    uVar9 = float32_to_float16(fVar5);
                  }
                  copy_make_border_image<unsigned_short>(&m_1,&m,iVar19,iVar16,iVar10,uVar9);
                }
                else if (_elemsize == 1) {
                  copy_make_border_image<signed_char>
                            (&m_1,&m,this->top,this->left,iVar10,(char)(int)fVar5);
                }
              }
            }
          }
        }
      }
      else if (iVar24 == 3) {
        uVar15 = uVar4 + uVar2 + _c;
        uVar17 = (ulong)uVar15;
        Mat::create(top_blob,iVar22,iVar19,uVar15,_elemsize,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          local_138 = 0;
          if ((int)uVar15 < 1) {
            uVar17 = 0;
          }
          iVar24 = _c - 1;
          for (uVar23 = 0; uVar23 != uVar17; uVar23 = uVar23 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            iVar22 = top_blob->d;
            pvVar7 = top_blob->data;
            uVar20 = top_blob->elemsize;
            sVar8 = top_blob->cstep;
            m.data = (void *)(sVar8 * uVar23 * uVar20 + (long)pvVar7);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = iVar22;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (uVar20 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar20;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            pfVar11 = (float *)(uVar23 * 4 + (long)(this->per_channel_pad_data).data);
            if (this->per_channel_pad_data_size == 0) {
              pfVar11 = &this->value;
            }
            fVar5 = *pfVar11;
            iVar19 = this->type;
            iVar10 = this->front;
            uVar9 = (unsigned_short)((uint)fVar5 >> 0x10);
            m.elemsize = uVar20;
            if (iVar19 == 0 &&
                ((long)(int)(iVar10 + _c) <= (long)uVar23 || (long)uVar23 < (long)iVar10)) {
              iVar19 = (int)m.cstep;
              if (_elemsize == 4) {
                iVar10 = iVar22 * iVar19;
                if (iVar22 * iVar19 < 1) {
                  iVar10 = 0;
                }
                for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                  *(float *)((long)pvVar7 + lVar12 * 4 + sVar8 * uVar20 * uVar23) = fVar5;
                }
              }
              else if (_elemsize == 2) {
                if (((this->super_Layer).support_fp16_storage == true) &&
                   (opt->use_fp16_storage == true)) {
                  uVar9 = float32_to_float16(fVar5);
                }
                uVar15 = iVar22 * iVar19;
                if (iVar22 * iVar19 < 1) {
                  uVar15 = 0;
                }
                for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
                  *(unsigned_short *)((long)pvVar7 + uVar18 * 2 + sVar8 * uVar20 * uVar23) = uVar9;
                }
              }
              else if (_elemsize == 1) {
                uVar15 = iVar22 * iVar19;
                if (iVar22 * iVar19 < 1) {
                  uVar15 = 0;
                }
                for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
                  *(char *)((long)pvVar7 + uVar18 + sVar8 * uVar20 * uVar23) = (char)(int)fVar5;
                }
              }
            }
            else {
              iVar10 = (int)uVar23 - iVar10;
              if (iVar19 == 2) {
                iVar22 = -iVar10;
                if (0 < iVar10) {
                  iVar22 = iVar10;
                }
                iVar22 = iVar22 - iVar24;
                iVar10 = -iVar22;
                if (iVar22 < 1) {
                  iVar10 = iVar22;
                }
                iVar10 = iVar10 + iVar24;
              }
              else if (iVar19 == 1) {
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                if (iVar24 <= iVar10) {
                  iVar10 = iVar24;
                }
              }
              m_1.w = bottom_blob->w;
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.data = (void *)((long)iVar10 * bottom_blob->cstep * m_1.elemsize +
                                 (long)bottom_blob->data);
              m_1.elempack = bottom_blob->elempack;
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.c = bottom_blob->d;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (m_1.elemsize * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                          m_1.elemsize;
              if (bottom_blob->dims == 4) {
                m_1.cstep = (long)m_1.h * (long)m_1.w;
              }
              if (_elemsize == 4) {
                copy_make_border_image<float>(&m_1,&m,this->top,this->left,iVar19,fVar5);
              }
              else if (_elemsize == 2) {
                iVar22 = this->top;
                iVar10 = this->left;
                if (((this->super_Layer).support_fp16_storage == true) &&
                   (opt->use_fp16_storage == true)) {
                  uVar9 = float32_to_float16(fVar5);
                }
                copy_make_border_image<unsigned_short>(&m_1,&m,iVar22,iVar10,iVar19,uVar9);
              }
              else if (_elemsize == 1) {
                copy_make_border_image<signed_char>
                          (&m_1,&m,this->top,this->left,iVar19,(char)(int)fVar5);
              }
            }
          }
        }
      }
      else {
        if (iVar24 == 2) {
          Mat::create(top_blob,iVar22,iVar19,_elemsize,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          if (_elemsize == 4) {
            copy_make_border_image<float>
                      (bottom_blob,top_blob,this->top,this->left,this->type,this->value);
          }
          else if (_elemsize == 2) {
            iVar24 = this->top;
            iVar22 = this->left;
            iVar19 = this->type;
            if (((this->super_Layer).support_fp16_storage == true) &&
               (opt->use_fp16_storage == true)) {
              uVar9 = float32_to_float16(this->value);
            }
            else {
              uVar9 = *(unsigned_short *)((long)&this->value + 2);
            }
            copy_make_border_image<unsigned_short>(bottom_blob,top_blob,iVar24,iVar22,iVar19,uVar9);
          }
          else if (_elemsize == 1) {
            copy_make_border_image<signed_char>
                      (bottom_blob,top_blob,this->top,this->left,this->type,(char)(int)this->value);
          }
        }
        local_138 = 0;
      }
    }
  }
  return local_138;
}

Assistant:

int Padding::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w + left + right;

    if (dims == 1)
    {
        top_blob.create(outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, 0, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, 0, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, 0, left, type, value);

        return 0;
    }

    int outh = h + top + bottom;

    if (dims == 2)
    {
        top_blob.create(outw, outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_make_border_image<signed char>(bottom_blob, top_blob, top, left, type, static_cast<signed char>(value));
        if (elemsize == 2)
            copy_make_border_image<unsigned short>(bottom_blob, top_blob, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(value) : float32_to_bfloat16(value));
        if (elemsize == 4)
            copy_make_border_image<float>(bottom_blob, top_blob, top, left, type, value);

        return 0;
    }

    if (dims == 3)
    {
        int outc = channels + front + behind;

        top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat borderm = top_blob.channel(q);

            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            //Channel padding
            if (((q < front) || (q >= (channels + front))) && type == 0)
            {
                if (elemsize == 1)
                {
                    borderm.fill(static_cast<signed char>(pad_value));
                }
                if (elemsize == 2)
                {
                    borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                }
                if (elemsize == 4)
                {
                    borderm.fill(pad_value);
                }
            }
            else
            {
                int q_ = q - front;

                if (type == 1)
                {
                    q_ = q_ <= 0 ? 0 : q_;
                    q_ = q_ >= channels - 1 ? channels - 1 : q_;
                }
                if (type == 2)
                {
                    q_ = abs(q_);
                    q_ = (channels - 1) - abs(q_ - (channels - 1));
                }
                const Mat m = bottom_blob.channel(q_);
                if (elemsize == 1)
                    copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                if (elemsize == 2)
                    copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                if (elemsize == 4)
                    copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outd = d + front + behind;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float pad_value = per_channel_pad_data_size ? per_channel_pad_data[q] : value;

            for (int z = 0; z < outd; z++)
            {
                Mat borderm = top_blob.channel(q).depth(z);

                // depth padding
                if (((z < front) || (z >= (d + front))) && type == 0)
                {
                    if (elemsize == 1)
                    {
                        borderm.fill(static_cast<signed char>(pad_value));
                    }
                    if (elemsize == 2)
                    {
                        borderm.fill(support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    }
                    if (elemsize == 4)
                    {
                        borderm.fill(pad_value);
                    }
                }
                else
                {
                    int z_ = z - front;

                    if (type == 1)
                    {
                        z_ = z_ <= 0 ? 0 : z_;
                        z_ = z_ >= d - 1 ? d - 1 : z_;
                    }
                    if (type == 2)
                    {
                        z_ = abs(z_);
                        z_ = (d - 1) - abs(z_ - (d - 1));
                    }
                    const Mat m = bottom_blob.channel(q).depth(z_);
                    if (elemsize == 1)
                        copy_make_border_image<signed char>(m, borderm, top, left, type, static_cast<signed char>(pad_value));
                    if (elemsize == 2)
                        copy_make_border_image<unsigned short>(m, borderm, top, left, type, support_fp16_storage && opt.use_fp16_storage ? float32_to_float16(pad_value) : float32_to_bfloat16(pad_value));
                    if (elemsize == 4)
                        copy_make_border_image<float>(m, borderm, top, left, type, pad_value);
                }
            }
        }

        return 0;
    }

    return 0;
}